

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::a64::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  BaseRAPass *pBVar1;
  BaseBuilder *pBVar2;
  Environment EVar3;
  Error EVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long lVar10;
  bool bVar11;
  RAWorkReg *workReg;
  RAWorkReg *local_48;
  RAInstBuilder *local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)invokeNode->field_0xf4;
  local_40 = ib;
  if (local_38 != 0) {
    puVar9 = &invokeNode->field_0x11c;
    bVar11 = true;
    lVar10 = 4;
    uVar8 = 0;
    do {
      if (uVar8 == 0x20) goto LAB_00136ae6;
      lVar7 = 0;
      do {
        uVar5 = *(uint *)(puVar9 + lVar7);
        if (uVar5 != 0) {
          if ((byte)invokeNode->field_0xf4 <= (byte)uVar8) {
            onInvoke();
LAB_00136acb:
            EVar4 = 0x1e;
            goto LAB_00136953;
          }
          if ((*(uint *)((long)invokeNode->_args->_data[0]._data + lVar7 * 4 + lVar10 + -0xc) & 7)
              == 1) {
            pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
            uVar6 = *(int *)((long)invokeNode->_args->_data[0]._data + lVar7 * 4 + lVar10 + -8) -
                    0x100;
            pBVar2 = (pBVar1->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar2[1].super_BaseEmitter._logger <= uVar6) goto LAB_00136acb;
            EVar3 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar6];
            local_48 = *(RAWorkReg **)((long)EVar3 + 0x28);
            if (local_48 == (RAWorkReg *)0x0) {
              EVar4 = BaseRAPass::_asWorkReg(pBVar1,(VirtReg *)EVar3,&local_48);
              if (EVar4 != 0) goto LAB_00136953;
              uVar5 = *(uint *)(puVar9 + lVar7);
            }
            if ((uVar5 >> 10 & 1) != 0) {
              if (((byte)local_48[0x21] & 0xf) == 0) {
LAB_00136911:
                EVar4 = RAInstBuilder::addCallArg(local_40,local_48,uVar5 >> 0x10 & 0xff);
                if (EVar4 == 0) goto LAB_00136925;
              }
              else {
                EVar4 = 3;
              }
LAB_00136953:
              if (bVar11) {
                return EVar4;
              }
              goto LAB_0013695e;
            }
            if ((uVar5 >> 8 & 1) != 0) {
              if (0x1fffffff < uVar5) goto LAB_00136ae1;
              if (((*(uint *)(_archTraits + (ulong)(uVar5 >> 0x18) * 4 + 0x524) ^
                   *(uint *)(local_48 + 0x20)) & 0xf00) == 0) goto LAB_00136911;
            }
          }
        }
LAB_00136925:
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x10);
      uVar8 = uVar8 + 1;
      puVar9 = puVar9 + 0x10;
      lVar10 = lVar10 + 0x40;
      bVar11 = uVar8 < local_38;
    } while (uVar8 != local_38);
  }
LAB_0013695e:
  lVar10 = 199;
  do {
    uVar5 = *(uint *)(&invokeNode->field_0x45 + lVar10);
    if (uVar5 == 0) break;
    if ((*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + lVar10 * 4) & 7) == 1) {
      pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
      uVar6 = *(int *)(&invokeNode->field_0x4 + lVar10 * 4) - 0x100;
      pBVar2 = (pBVar1->super_FuncPass).super_Pass._cb;
      if (*(uint *)&pBVar2[1].super_BaseEmitter._logger <= uVar6) {
        return 0x1e;
      }
      EVar3 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar6];
      local_48 = *(RAWorkReg **)((long)EVar3 + 0x28);
      if (local_48 == (RAWorkReg *)0x0) {
        EVar4 = BaseRAPass::_asWorkReg(pBVar1,(VirtReg *)EVar3,&local_48);
        if (EVar4 != 0) {
          return EVar4;
        }
        uVar5 = *(uint *)(&invokeNode->field_0x45 + lVar10);
      }
      if ((uVar5 >> 8 & 1) == 0) {
        return 0x19;
      }
      if (0x1fffffff < uVar5) {
        onInvoke();
LAB_00136ae1:
        onInvoke();
LAB_00136ae6:
        onInvoke();
        return 0;
      }
      if ((((*(uint *)(_archTraits + (ulong)(uVar5 >> 0x18) * 4 + 0x524) ^
            *(uint *)(local_48 + 0x20)) & 0xf00) == 0) &&
         (EVar4 = RAInstBuilder::addCallRet(local_40,local_48,uVar5 >> 0x10 & 0xff), EVar4 != 0)) {
        return EVar4;
      }
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xd7);
  pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
  *(uint *)(local_40 + 0x28) =
       ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[0] & 0x3f)) |
        *(uint *)&invokeNode->field_0xa4);
  *(uint *)(local_40 + 0x2c) =
       ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[1] & 0x3f)) |
        *(uint *)&invokeNode->field_0xa8);
  *(uint *)(local_40 + 0x30) =
       ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[2] & 0x3f)) |
        *(uint *)&invokeNode->field_0xac);
  *(uint *)(local_40 + 0x34) =
       ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[3] & 0x3f)) |
        *(uint *)&invokeNode->field_0xb0);
  return 0;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    const Operand& op = invokeNode->ret(retIndex);
    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  ib._clobbered[0] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(0)]) & ~fd.preservedRegs(RegGroup(0));
  ib._clobbered[1] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(1)]) & ~fd.preservedRegs(RegGroup(1));
  ib._clobbered[2] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(2)]) & ~fd.preservedRegs(RegGroup(2));
  ib._clobbered[3] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(3)]) & ~fd.preservedRegs(RegGroup(3));

  return kErrorOk;
}